

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O1

void __thiscall
TEST_GROUP_CppUTestGroupMemoryLeakWarningTest::setup
          (TEST_GROUP_CppUTestGroupMemoryLeakWarningTest *this)

{
  TestTestingFixture *this_00;
  MemoryLeakDetector *this_01;
  TestMemoryAllocator *this_02;
  MemoryLeakWarningPlugin *this_03;
  SimpleString local_20;
  
  this_00 = (TestTestingFixture *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                         ,0x4f);
  TestTestingFixture::TestTestingFixture(this_00);
  this->fixture = this_00;
  this_01 = (MemoryLeakDetector *)
            operator_new(0x1298,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                         ,0x50);
  MemoryLeakDetector::MemoryLeakDetector(this_01,&(this->dummy).super_MemoryLeakFailure);
  detector = this_01;
  this_02 = (TestMemoryAllocator *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                         ,0x51);
  TestMemoryAllocator::TestMemoryAllocator(this_02,"generic","alloc","free");
  ::allocator = this_02;
  this_03 = (MemoryLeakWarningPlugin *)
            operator_new(0x48,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                         ,0x52);
  SimpleString::SimpleString(&local_20,"TestMemoryLeakWarningPlugin");
  MemoryLeakWarningPlugin::MemoryLeakWarningPlugin(this_03,&local_20,detector);
  memPlugin = this_03;
  SimpleString::~SimpleString(&local_20);
  TestTestingFixture::installPlugin(this->fixture,&memPlugin->super_TestPlugin);
  (*(memPlugin->super_TestPlugin)._vptr_TestPlugin[0xd])();
  leak1 = (char *)0x0;
  leak2 = (long *)0x0;
  return;
}

Assistant:

void setup() _override
    {
        fixture = new TestTestingFixture();
        detector = new MemoryLeakDetector(&dummy);
        allocator = new TestMemoryAllocator;
        memPlugin = new MemoryLeakWarningPlugin("TestMemoryLeakWarningPlugin", detector);
        fixture->installPlugin(memPlugin);
        memPlugin->enable();

        leak1 = NULLPTR;
        leak2 = NULLPTR;
    }